

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

NaVector * __thiscall NaVector::add(NaVector *this,NaVector *rVect)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 *puVar4;
  long *in_RSI;
  NaVector *in_RDI;
  uint i;
  uint local_14;
  
  iVar1 = (*in_RDI->_vptr_NaVector[6])();
  iVar2 = (**(code **)(*in_RSI + 0x30))();
  if (iVar1 != iVar2) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 2;
    __cxa_throw(puVar4,&NaException::typeinfo,0);
  }
  local_14 = 0;
  while( true ) {
    uVar3 = (*in_RDI->_vptr_NaVector[6])();
    if (uVar3 <= local_14) break;
    in_RDI->pVect[local_14] = *(double *)(in_RSI[2] + (ulong)local_14 * 8) + in_RDI->pVect[local_14]
    ;
    local_14 = local_14 + 1;
  }
  return in_RDI;
}

Assistant:

NaVector&
NaVector::add (const NaVector& rVect)
{
    if(dim() != rVect.dim())
        throw(na_size_mismatch);

    unsigned    i;
    for(i = 0; i < dim(); ++i)
        pVect[i] += rVect.pVect[i];

    return *this;
}